

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void reverse(lua_State *L,StkId from,StkId to)

{
  ushort uVar1;
  ushort uVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  
  while( true ) {
    if (to <= from) {
      return;
    }
    uVar1 = from->tt_;
    pGVar3 = (from->value_).gc;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((L != (lua_State *)0x0 && ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xc9,"void reverse(lua_State *, StkId, StkId)");
    }
    pGVar4 = (to->value_).gc;
    (from->value_).gc = pGVar4;
    uVar2 = to->tt_;
    from->tt_ = uVar2;
    if (((short)uVar2 < 0) &&
       (((uVar2 & 0x7f) != (ushort)pGVar4->tt ||
        ((L != (lua_State *)0x0 && ((pGVar4->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0xca,"void reverse(lua_State *, StkId, StkId)");
    }
    (to->value_).gc = pGVar3;
    to->tt_ = uVar1;
    if (((short)uVar1 < 0) &&
       (((uVar1 & 0x7f) != (ushort)pGVar3->tt ||
        ((L != (lua_State *)0x0 && ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) != 0))))))
    break;
    from = from + 1;
    to = to + -1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0xcb,"void reverse(lua_State *, StkId, StkId)");
}

Assistant:

static void reverse (lua_State *L, StkId from, StkId to) {
  for (; from < to; from++, to--) {
    TValue temp;
    setobj(L, &temp, from);
    setobjs2s(L, from, to);
    setobj2s(L, to, &temp);
  }
}